

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::BindTableFunctionInternal
          (Binder *this,TableFunction *table_function,TableFunctionRef *ref,
          vector<duckdb::Value,_true> *parameters,named_parameter_map_t *named_parameters,
          vector<duckdb::LogicalType,_true> input_table_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          input_table_names)

{
  pointer *ppVVar1;
  __node_base *p_Var2;
  pointer pbVar3;
  code *pcVar4;
  long lVar5;
  bool bVar6;
  virtual_column_map_t virtual_columns_00;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> uVar7;
  templated_unique_single_t tVar8;
  idx_t iVar9;
  char cVar10;
  pointer pPVar11;
  BaseExpression *this_00;
  FunctionExpression *pFVar12;
  pointer pLVar13;
  pointer pTVar14;
  reference pvVar15;
  long *plVar16;
  pointer pLVar17;
  vector<duckdb::ColumnIndex,_true> *bound_column_ids;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  InternalException *pIVar18;
  InvalidInputException *this_01;
  BinderException *this_02;
  ulong uVar19;
  __buckets_ptr pp_Var20;
  pointer pVVar21;
  element_type *peVar22;
  ulong uVar23;
  column_t column_id;
  char cVar24;
  pointer pVVar25;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_R9;
  undefined8 uStack_248;
  pointer *__ptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  templated_unique_single_t get;
  uint local_200;
  undefined1 local_1f8 [40];
  idx_t bind_index;
  virtual_column_map_t virtual_columns;
  vector<duckdb::LogicalType,_true> return_types;
  undefined1 local_160 [24];
  string function_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  pVVar21 = parameters[1].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar21 == (pointer)0x0) {
    if (parameters[4].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      ppVVar1 = &parameters[4].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)ppVVar1);
      if ((pPVar11->super_BaseExpression).type == FUNCTION) {
        this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)ppVVar1)->super_BaseExpression;
        pFVar12 = BaseExpression::Cast<duckdb::FunctionExpression>(this_00);
        pVVar25 = (pointer)(pFVar12->function_name)._M_dataplus._M_p;
        pVVar21 = (pointer)(pFVar12->function_name)._M_string_length;
        goto LAB_00e031f4;
      }
    }
    function_name._M_dataplus._M_p = (pointer)&function_name.field_2;
    function_name._M_string_length = 0;
    function_name.field_2._M_local_buf[0] = '\0';
  }
  else {
    pVVar25 = (parameters->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
LAB_00e031f4:
    function_name._M_dataplus._M_p = (pointer)&function_name.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&function_name,pVVar25,&(pVVar25->type_).id_ + (long)pVVar21);
  }
  bind_index = GenerateTableIndex((Binder *)table_function);
  bind_data.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
       (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>
       )0x0;
  return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3 = ref[1].super_TableRef.column_name_alias.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((ref[1].super_TableRef.column_name_alias.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0 &&
      ref[1].super_TableRef.column_name_alias.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) && pbVar3 == (pointer)0x0) {
    this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_before_begin._M_nxt;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&virtual_columns,
               "Cannot call function \"%s\" directly - it has no bind function","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    lVar5 = *(long *)&(ref->super_TableRef).type;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,lVar5,(ref->super_TableRef).alias._M_dataplus._M_p + lVar5);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (this_01,(string *)&virtual_columns,&local_e8);
    __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  virtual_columns._M_h._M_rehash_policy._0_8_ = ref[3].super_TableRef.query_location.index;
  virtual_columns._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       input_table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  virtual_columns._M_h._M_element_count =
       (size_type)
       input_table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  virtual_columns._M_h._M_buckets = (__buckets_ptr)named_parameters;
  virtual_columns._M_h._M_bucket_count = (size_type)in_R9;
  virtual_columns._M_h._M_rehash_policy._M_next_resize = (size_t)table_function;
  virtual_columns._M_h._M_single_bucket = (__node_base_ptr)ref;
  if (pbVar3 != (pointer)0x0) {
    (*(code *)pbVar3)(this,(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction
                           .super_Function.name._M_string_length,&virtual_columns,bind_index,
                      &return_names);
    if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)this);
      LogicalOperator::ResolveOperatorTypes(pLVar13);
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)this);
      if (((long)(pLVar13->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pLVar13->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
          ((long)return_names.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)return_names.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
        pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
        get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
        super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
        super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl =
             (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)local_1f8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&get,"Failed to bind \"%s\": return_types/names must have same size",""
                  );
        local_88._0_8_ = local_88 + 0x10;
        lVar5 = *(long *)&(ref->super_TableRef).type;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,lVar5,(ref->super_TableRef).alias._M_dataplus._M_p + lVar5);
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar18,(string *)&get,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
        __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)this);
      (*pLVar13->_vptr_LogicalOperator[2])(local_160,pLVar13);
      for (peVar22 = (element_type *)local_160._0_8_; peVar22 != (element_type *)local_160._8_8_;
          peVar22 = (element_type *)&peVar22->context) {
        if ((peVar22->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)bind_index) {
          pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
          get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
          super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
          super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)local_1f8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&get,
                     "Failed to bind \"%s\": root bind index must be the passed in bind index","");
          local_a8._0_8_ = local_a8 + 0x10;
          lVar5 = *(long *)&(ref->super_TableRef).type;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,lVar5,(ref->super_TableRef).alias._M_dataplus._M_p + lVar5);
          InternalException::InternalException<std::__cxx11::string>
                    (pIVar18,(string *)&get,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
          __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if ((_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)local_160._0_8_ !=
          (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0) {
        operator_delete((void *)local_160._0_8_);
      }
      iVar9 = bind_index;
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)this);
      BindContext::AddGenericBinding
                ((BindContext *)
                 &(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs.
                  type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 iVar9,&function_name,&return_names,&pLVar13->types);
      goto LAB_00e03a0c;
    }
    peVar22 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar22 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar22->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  ppVVar1 = &parameters[3].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pbVar3 = ref[1].super_TableRef.column_name_alias.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar3 == (pointer)0x0) ||
     ((*(code *)pbVar3)(&get,(table_function->super_SimpleNamedParameterFunction).
                             super_SimpleFunction.super_Function.name._M_string_length,
                        &virtual_columns),
     get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
     super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
     super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
     super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl ==
     (__uniq_ptr_data<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true,_true>)0x0))
  {
    pbVar3 = ref[1].super_TableRef.column_name_alias.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar3 == (pointer)0x0) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
      super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)local_1f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&get,
                 "Failed to bind \"%s\": nullptr returned from bind_replace without bind function",
                 "");
      local_c8._0_8_ = local_c8 + 0x10;
      lVar5 = *(long *)&(ref->super_TableRef).type;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,lVar5,(ref->super_TableRef).alias._M_dataplus._M_p + lVar5);
      BinderException::BinderException<std::__cxx11::string>
                (this_02,(string *)&get,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*(code *)pbVar3)(&get,(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction
                           .super_Function.name._M_string_length,&virtual_columns,&return_types,
                      &return_names);
    tVar8 = get;
    uVar7 = bind_data;
    get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
    super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)
         (__uniq_ptr_data<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true,_true>)
         0x0;
    bind_data.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
    _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         tVar8.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
         super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
         super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl;
    if (uVar7.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
        _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
        super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)uVar7.
                            super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                            .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl + 8))
                ();
    }
    if (get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
        super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
        super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)get.
                            super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>
                            .super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl + 8))()
      ;
    }
    if (((long)return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        ((long)return_names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)return_names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
      pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
      virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_before_begin._M_nxt;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&virtual_columns,
                 "Failed to bind \"%s\": return_types/names must have same size","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      lVar5 = *(long *)&(ref->super_TableRef).type;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,lVar5,(ref->super_TableRef).alias._M_dataplus._M_p + lVar5);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar18,(string *)&virtual_columns,&local_108);
      __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
      virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_before_begin._M_nxt;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&virtual_columns,
                 "Failed to bind \"%s\": Table function must return at least one column","");
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      lVar5 = *(long *)&(ref->super_TableRef).type;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,lVar5,(ref->super_TableRef).alias._M_dataplus._M_p + lVar5);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar18,(string *)&virtual_columns,&local_128);
      __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (parameters[3].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        parameters[3].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar23 = 0;
      do {
        if ((ulong)((long)return_names.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)return_names.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23) break;
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)ppVVar1,uVar23);
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&return_names,uVar23);
        ::std::__cxx11::string::_M_assign((string *)pvVar15);
        uVar23 = uVar23 + 1;
      } while (uVar23 < (ulong)((long)parameters[3].
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)parameters[3].
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish >> 5));
    }
    if (return_names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        return_names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var2 = &virtual_columns._M_h._M_before_begin;
      uVar23 = 0;
      do {
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&return_names,uVar23);
        if (pvVar15->_M_string_length == 0) {
          cVar24 = '\x01';
          if (9 < uVar23) {
            uVar19 = uVar23;
            cVar10 = '\x04';
            do {
              cVar24 = cVar10;
              if (uVar19 < 100) {
                cVar24 = cVar24 + -2;
                goto LAB_00e036e3;
              }
              if (uVar19 < 1000) {
                cVar24 = cVar24 + -1;
                goto LAB_00e036e3;
              }
              if (uVar19 < 10000) goto LAB_00e036e3;
              bVar6 = 99999 < uVar19;
              uVar19 = uVar19 / 10000;
              cVar10 = cVar24 + '\x04';
            } while (bVar6);
            cVar24 = cVar24 + '\x01';
          }
LAB_00e036e3:
          get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
          super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
          super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)
               (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)local_1f8;
          ::std::__cxx11::string::_M_construct((ulong)&get,cVar24);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)get.
                             super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>
                             .super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl,
                     local_200,uVar23);
          plVar16 = (long *)::std::__cxx11::string::replace((ulong)&get,0,(char *)0x0,0x1e3be3e);
          pp_Var20 = (__buckets_ptr)(plVar16 + 2);
          if ((__buckets_ptr)*plVar16 == pp_Var20) {
            virtual_columns._M_h._M_before_begin._M_nxt = *pp_Var20;
            virtual_columns._M_h._M_element_count = plVar16[3];
            virtual_columns._M_h._M_buckets = &p_Var2->_M_nxt;
          }
          else {
            virtual_columns._M_h._M_before_begin._M_nxt = *pp_Var20;
            virtual_columns._M_h._M_buckets = (__buckets_ptr)*plVar16;
          }
          virtual_columns._M_h._M_bucket_count = plVar16[1];
          *plVar16 = (long)pp_Var20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&return_names,uVar23);
          ::std::__cxx11::string::operator=((string *)pvVar15,(string *)&virtual_columns);
          if ((__node_base *)virtual_columns._M_h._M_buckets != p_Var2) {
            operator_delete(virtual_columns._M_h._M_buckets);
          }
          if (get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>
              .super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl !=
              (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)local_1f8) {
            operator_delete((void *)get.
                                    super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>
                                    .super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl
                           );
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < (ulong)((long)return_names.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)return_names.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_single_bucket;
    virtual_columns._M_h._M_bucket_count = 1;
    virtual_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    virtual_columns._M_h._M_element_count = 0;
    virtual_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    virtual_columns._M_h._M_rehash_policy._M_next_resize = 0;
    virtual_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pcVar4 = (code *)ref[3].super_TableRef.alias._M_string_length;
    if (pcVar4 != (code *)0x0) {
      (*pcVar4)(&get,(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                     super_Function.name._M_string_length,
                bind_data.
                super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
                _M_t.
                super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_move_assign(&virtual_columns._M_h,&get);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&get);
    }
    make_uniq<duckdb::LogicalGet,unsigned_long&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>&>
              ((duckdb *)&get,&bind_index,(TableFunction *)ref,&bind_data,&return_types,
               &return_names,&virtual_columns);
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->(&get);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::operator=
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&pLVar17->parameters,
               (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)named_parameters);
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->(&get);
    if (&(pLVar17->named_parameters)._M_h != in_R9) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pLVar17->named_parameters,in_R9);
    }
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->(&get);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pLVar17->input_table_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               input_table_types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start);
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->(&get);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pLVar17->input_table_names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)input_table_types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
    if (((*(long *)&ref[2].super_TableRef.type != 0) &&
        (*(char *)((long)&ref[3].super_TableRef.sample.
                          super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                          .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl + 1)
         == '\0')) &&
       (return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      column_id = 0;
      do {
        pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->(&get);
        LogicalGet::AddColumnId(pLVar17,column_id);
        column_id = column_id + 1;
      } while (column_id <
               (ulong)(((long)return_types.
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)return_types.
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              );
    }
    iVar9 = bind_index;
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->(&get);
    bound_column_ids = LogicalGet::GetMutableColumnIds(pLVar17);
    pLVar17 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->(&get);
    entry = LogicalGet::GetTable(pLVar17);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,&virtual_columns);
    virtual_columns_00._M_h._M_bucket_count = uStack_248;
    virtual_columns_00._M_h._M_buckets = (__buckets_ptr)&local_68;
    virtual_columns_00._M_h._M_before_begin._M_nxt = (_Hash_node_base *)ref;
    virtual_columns_00._M_h._M_element_count = (size_type)this;
    virtual_columns_00._M_h._M_rehash_policy._0_8_ = table_function;
    virtual_columns_00._M_h._M_rehash_policy._M_next_resize =
         (size_t)return_names.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    virtual_columns_00._M_h._M_single_bucket =
         (__node_base_ptr)
         return_names.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    BindContext::AddTableFunction
              ((BindContext *)
               &(table_function->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs.
                type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               iVar9,&function_name,&return_names,&return_types,bound_column_ids,
               (optional_ptr<duckdb::StandardEntry,_true>)entry.ptr,virtual_columns_00);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    tVar8 = get;
    get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
    super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)
         (__uniq_ptr_data<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true,_true>)
         0x0;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         tVar8.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
         super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
         super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl;
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&virtual_columns._M_h);
  }
  else {
    if (parameters[1].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      pTVar14 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                            *)&get);
      ::std::__cxx11::string::_M_assign((string *)&pTVar14->alias);
    }
    if (parameters[3].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        parameters[3].super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pTVar14 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                            *)&get);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pTVar14->column_name_alias,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppVVar1);
    }
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)&get);
    Bind((Binder *)local_160,(TableRef *)table_function);
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)local_160);
    CreatePlan(this,(BoundTableRef *)table_function);
    if ((element_type *)local_160._0_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_160._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if (get.super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
        super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>.
        super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)get.
                            super_unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalGet_*,_std::default_delete<duckdb::LogicalGet>_>
                            .super__Head_base<0UL,_duckdb::LogicalGet_*,_false>._M_head_impl + 8))()
      ;
    }
  }
LAB_00e03a0c:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&return_names);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  if (bind_data.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
      _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>)
      0x0) {
    (**(code **)(*(long *)bind_data.
                          super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                          .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl + 8))()
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)function_name._M_dataplus._M_p != &function_name.field_2) {
    operator_delete(function_name._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::BindTableFunctionInternal(TableFunction &table_function,
                                                              const TableFunctionRef &ref, vector<Value> parameters,
                                                              named_parameter_map_t named_parameters,
                                                              vector<LogicalType> input_table_types,
                                                              vector<string> input_table_names) {
	auto function_name = GetAlias(ref);
	auto &column_name_alias = ref.column_name_alias;

	auto bind_index = GenerateTableIndex();
	// perform the binding
	unique_ptr<FunctionData> bind_data;
	vector<LogicalType> return_types;
	vector<string> return_names;
	if (table_function.bind || table_function.bind_replace || table_function.bind_operator) {
		TableFunctionBindInput bind_input(parameters, named_parameters, input_table_types, input_table_names,
		                                  table_function.function_info.get(), this, table_function, ref);
		if (table_function.bind_operator) {
			auto new_plan = table_function.bind_operator(context, bind_input, bind_index, return_names);
			if (new_plan) {
				new_plan->ResolveOperatorTypes();
				if (new_plan->types.size() != return_names.size()) {
					throw InternalException("Failed to bind \"%s\": return_types/names must have same size",
					                        table_function.name);
				}
				for (auto &binding : new_plan->GetColumnBindings()) {
					if (binding.table_index != bind_index) {
						throw InternalException(
						    "Failed to bind \"%s\": root bind index must be the passed in bind index",
						    table_function.name);
					}
				}
				bind_context.AddGenericBinding(bind_index, function_name, return_names, new_plan->types);
				return new_plan;
			}
		}
		if (table_function.bind_replace) {
			auto new_plan = table_function.bind_replace(context, bind_input);
			if (new_plan) {
				if (!ref.alias.empty()) {
					new_plan->alias = ref.alias;
				}
				if (!ref.column_name_alias.empty()) {
					new_plan->column_name_alias = ref.column_name_alias;
				}
				return CreatePlan(*Bind(*new_plan));
			}
		}
		if (!table_function.bind) {
			throw BinderException("Failed to bind \"%s\": nullptr returned from bind_replace without bind function",
			                      table_function.name);
		}
		bind_data = table_function.bind(context, bind_input, return_types, return_names);
	} else {
		throw InvalidInputException("Cannot call function \"%s\" directly - it has no bind function",
		                            table_function.name);
	}
	if (return_types.size() != return_names.size()) {
		throw InternalException("Failed to bind \"%s\": return_types/names must have same size", table_function.name);
	}
	if (return_types.empty()) {
		throw InternalException("Failed to bind \"%s\": Table function must return at least one column",
		                        table_function.name);
	}
	// overwrite the names with any supplied aliases
	for (idx_t i = 0; i < column_name_alias.size() && i < return_names.size(); i++) {
		return_names[i] = column_name_alias[i];
	}
	for (idx_t i = 0; i < return_names.size(); i++) {
		if (return_names[i].empty()) {
			return_names[i] = "C" + to_string(i);
		}
	}
	virtual_column_map_t virtual_columns;
	if (table_function.get_virtual_columns) {
		virtual_columns = table_function.get_virtual_columns(context, bind_data.get());
	}

	auto get = make_uniq<LogicalGet>(bind_index, table_function, std::move(bind_data), return_types, return_names,
	                                 virtual_columns);
	get->parameters = parameters;
	get->named_parameters = named_parameters;
	get->input_table_types = input_table_types;
	get->input_table_names = input_table_names;
	if (table_function.in_out_function && !table_function.projection_pushdown) {
		for (idx_t i = 0; i < return_types.size(); i++) {
			get->AddColumnId(i);
		}
	}
	// now add the table function to the bind context so its columns can be bound
	bind_context.AddTableFunction(bind_index, function_name, return_names, return_types, get->GetMutableColumnIds(),
	                              get->GetTable().get(), std::move(virtual_columns));
	return std::move(get);
}